

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIDFontWriter.cpp
# Opt level: O2

EStatusCode __thiscall
CIDFontWriter::WriteFont
          (CIDFontWriter *this,FreeTypeFaceWrapper *inFontInfo,
          WrittenFontRepresentation *inFontOccurrence,ObjectsContext *inObjectsContext,
          IDescendentFontWriter *inDescendentFontWriter,bool inEmbedFont)

{
  EStatusCode EVar1;
  Trace *pTVar2;
  DictionaryContext *this_00;
  IndirectObjectsReferenceRegistry *pIVar3;
  ObjectIDType indirectObjectID;
  ObjectIDType inObjectReference;
  DictionaryContext *this_01;
  string fontName;
  string postscriptFontName;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  EVar1 = ObjectsContext::StartNewIndirectObject
                    (inObjectsContext,inFontOccurrence->mWrittenObjectID);
  if (EVar1 != eSuccess) {
    pTVar2 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar2,
                      "CIDFontWriter::WriteFont, unexpected failure. could not write font object %ld"
                      ,inFontOccurrence->mWrittenObjectID);
    return EVar1;
  }
  this->mFontInfo = inFontInfo;
  this->mFontOccurrence = inFontOccurrence;
  this->mObjectsContext = inObjectsContext;
  this_00 = ObjectsContext::StartDictionary(inObjectsContext);
  DictionaryContext::WriteKey(this_00,&scType_abi_cxx11_);
  DictionaryContext::WriteNameValue(this_00,&scFont_abi_cxx11_);
  DictionaryContext::WriteKey(this_00,&scSubtype_abi_cxx11_);
  DictionaryContext::WriteNameValue(this_00,&scType0_abi_cxx11_);
  DictionaryContext::WriteKey(this_00,&scBaseFont_abi_cxx11_);
  FreeTypeFaceWrapper::GetPostscriptName_abi_cxx11_(&postscriptFontName,inFontInfo);
  if (postscriptFontName._M_string_length == 0) {
    pTVar2 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar2,
                      "CIDFontWriter::WriteFont, unexpected failure. no postscript font name for font"
                     );
    EVar1 = eFailure;
    goto LAB_001c9d86;
  }
  if (inEmbedFont) {
    ObjectsContext::GenerateSubsetFontPrefix_abi_cxx11_(&local_70,inObjectsContext);
    std::operator+(&local_50,&local_70,&scPlus_abi_cxx11_);
    std::operator+(&fontName,&local_50,&postscriptFontName);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    std::__cxx11::string::string((string *)&fontName,(string *)&postscriptFontName);
  }
  this_01 = this_00;
  DictionaryContext::WriteNameValue(this_00,&fontName);
  WriteEncoding((CIDFontWriter *)this_01,this_00);
  pIVar3 = ObjectsContext::GetInDirectObjectsRegistry(this->mObjectsContext);
  indirectObjectID = IndirectObjectsReferenceRegistry::AllocateNewObjectID(pIVar3);
  DictionaryContext::WriteKey(this_00,&scDescendantFonts_abi_cxx11_);
  ObjectsContext::StartArray(this->mObjectsContext);
  ObjectsContext::WriteNewIndirectObjectReference
            (this->mObjectsContext,indirectObjectID,eTokenSeparatorSpace);
  ObjectsContext::EndArray(this->mObjectsContext,eTokenSeparatorEndLine);
  CalculateCharacterEncodingArray(this);
  if ((ulong)(((long)(this->mCharactersVector).
                     super__Vector_base<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->mCharactersVector).
                    super__Vector_base<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x28) < 2) {
    EVar1 = ObjectsContext::EndDictionary(inObjectsContext,this_00);
    if (EVar1 == eSuccess) {
      ObjectsContext::EndIndirectObject(inObjectsContext);
LAB_001c9d52:
      EVar1 = (*inDescendentFontWriter->_vptr_IDescendentFontWriter[2])
                        (inDescendentFontWriter,indirectObjectID,&fontName,this->mFontInfo,
                         &this->mCharactersVector,this->mObjectsContext,inEmbedFont);
    }
    else {
      pTVar2 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar2,
                        "CIDFontWriter::WriteFont, unexpected failure. Failed to end dictionary in font write."
                       );
    }
  }
  else {
    DictionaryContext::WriteKey(this_00,&scToUnicode_abi_cxx11_);
    pIVar3 = ObjectsContext::GetInDirectObjectsRegistry(this->mObjectsContext);
    inObjectReference = IndirectObjectsReferenceRegistry::AllocateNewObjectID(pIVar3);
    DictionaryContext::WriteNewObjectReferenceValue(this_00,inObjectReference);
    EVar1 = ObjectsContext::EndDictionary(inObjectsContext,this_00);
    if (EVar1 == eSuccess) {
      ObjectsContext::EndIndirectObject(inObjectsContext);
      EVar1 = WriteToUnicodeMap(this,inObjectReference);
      if (EVar1 == eSuccess) goto LAB_001c9d52;
      pTVar2 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar2,"CIDFontWriter::WriteFont, failed to write unicode map %ld",
                        inObjectReference);
    }
    else {
      pTVar2 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar2,
                        "CIDFontWriter::WriteFont, unexpected failure. Failed to end dictionary in font write."
                       );
    }
  }
  std::__cxx11::string::~string((string *)&fontName);
LAB_001c9d86:
  std::__cxx11::string::~string((string *)&postscriptFontName);
  return EVar1;
}

Assistant:

EStatusCode CIDFontWriter::WriteFont(FreeTypeFaceWrapper& inFontInfo,
										WrittenFontRepresentation* inFontOccurrence,
										ObjectsContext* inObjectsContext,
										IDescendentFontWriter* inDescendentFontWriter,
										bool inEmbedFont)
{

	EStatusCode status = PDFHummus::eSuccess;

	do
	{
		status = inObjectsContext->StartNewIndirectObject(inFontOccurrence->mWrittenObjectID);
		if(status != eSuccess)
		{
			TRACE_LOG1("CIDFontWriter::WriteFont, unexpected failure. could not write font object %ld",inFontOccurrence->mWrittenObjectID);
			break;
		}

		mFontInfo = &inFontInfo;
		mFontOccurrence = inFontOccurrence;
		mObjectsContext = inObjectsContext;
		DictionaryContext* fontContext = inObjectsContext->StartDictionary();

		// Type
		fontContext->WriteKey(scType);
		fontContext->WriteNameValue(scFont);

		// SubType
		fontContext->WriteKey(scSubtype);
		fontContext->WriteNameValue(scType0);

		// BaseFont
		fontContext->WriteKey(scBaseFont);
		std::string postscriptFontName = inFontInfo.GetPostscriptName();
		if(postscriptFontName.length() == 0)
		{
			TRACE_LOG("CIDFontWriter::WriteFont, unexpected failure. no postscript font name for font");
			status = PDFHummus::eFailure;
			break;
		}
		std::string fontName = inEmbedFont ? (inObjectsContext->GenerateSubsetFontPrefix() + scPlus + postscriptFontName) : postscriptFontName;
		fontContext->WriteNameValue(fontName);

		WriteEncoding(fontContext);

		// DescendantFonts 
		ObjectIDType descendantFontID = mObjectsContext->GetInDirectObjectsRegistry().AllocateNewObjectID();

		fontContext->WriteKey(scDescendantFonts);
		mObjectsContext->StartArray();
		mObjectsContext->WriteNewIndirectObjectReference(descendantFontID);
		mObjectsContext->EndArray(eTokenSeparatorEndLine);

		CalculateCharacterEncodingArray(); // put the charachter in the order of encoding, for the ToUnicode map

		// ToUnicode
		if (mCharactersVector.size() > 1) {
			// make sure there's more than just the 0 char (which would make this an array of size of one
			fontContext->WriteKey(scToUnicode);
			ObjectIDType toUnicodeMapObjectID = mObjectsContext->GetInDirectObjectsRegistry().AllocateNewObjectID();
			fontContext->WriteNewObjectReferenceValue(toUnicodeMapObjectID);

			status = inObjectsContext->EndDictionary(fontContext);
			if (status != PDFHummus::eSuccess)
			{
				TRACE_LOG("CIDFontWriter::WriteFont, unexpected failure. Failed to end dictionary in font write.");
				break;
			}
			inObjectsContext->EndIndirectObject();
			status = WriteToUnicodeMap(toUnicodeMapObjectID);
			if (status != PDFHummus::eSuccess)
			{
				TRACE_LOG1("CIDFontWriter::WriteFont, failed to write unicode map %ld", toUnicodeMapObjectID);
				break;
			}			
		}
		else {
			// else just finish font writing (a bit of an edge case here...but should take care of, for cleanliness)
			status = inObjectsContext->EndDictionary(fontContext);
			if (status != PDFHummus::eSuccess)
			{
				TRACE_LOG("CIDFontWriter::WriteFont, unexpected failure. Failed to end dictionary in font write.");
				break;
			}
			inObjectsContext->EndIndirectObject();
		}

		// Write the descendant font
		status = inDescendentFontWriter->WriteFont(descendantFontID, fontName, *mFontInfo, mCharactersVector, mObjectsContext, inEmbedFont);

	} while(false);

	return status;
}